

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_choice.cpp
# Opt level: O2

void Am_Choice_Running_Method_proc
               (Am_Object *inter,Am_Object *object,Am_Object *event_window,Am_Input_Event *ev)

{
  int x;
  int y;
  Am_Value *pAVar1;
  Am_Object command_obj;
  Am_Inter_Internal_Method inter_method;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Inter_Internal_Method local_48;
  
  local_48.from_wrapper = (Am_Method_Wrapper *)0x0;
  local_48.Call = (Am_Inter_Internal_Method_Type *)0x0;
  pAVar1 = Am_Object::Get(&Am_Interactor,0xbf,0);
  Am_Inter_Internal_Method::operator=(&local_48,pAVar1);
  (*local_48.Call)(inter,object,event_window,ev);
  local_70.data = (Am_Object_Data *)0x0;
  pAVar1 = Am_Object::Get(inter,0xc5,0);
  Am_Object::operator=(&local_70,pAVar1);
  Am_Object::Am_Object(&local_50,&local_70);
  Am_Object::Am_Object(&local_58,object);
  Am_Object::Am_Object(&local_60,inter);
  x = ev->x;
  y = ev->y;
  Am_Object::Am_Object(&local_68,event_window);
  Choice_Handle_New_Old(&local_50,&local_58,&local_60,x,y,&local_68,ev->input_char);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_70);
  return;
}

Assistant:

Am_Define_Method(Am_Inter_Internal_Method, void, Am_Choice_Running_Method,
                 (Am_Object & inter, Am_Object &object, Am_Object &event_window,
                  Am_Input_Event *ev))
{

  Am_INTER_TRACE_PRINT(inter, "Choice running over " << object);
  // first, call the prototype's method
  Am_Inter_Internal_Method inter_method;
  inter_method = Am_Interactor.Get(Am_INTER_RUNNING_METHOD);
  inter_method.Call(inter, object, event_window, ev);

  Am_Object command_obj;
  command_obj = inter.Get(Am_COMMAND);
  Choice_Handle_New_Old(command_obj, object, inter, ev->x, ev->y, event_window,
                        ev->input_char);
}